

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *column)

{
  byte bVar1;
  uint uVar2;
  ImGuiSortDirection IVar3;
  int n;
  
  if ((column->field_0x65 & 0xc) == 0) {
    __assert_fail("column->SortDirectionsAvailCount > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0xa53,
                  "ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *)");
  }
  if (column->SortOrder == -1) {
    uVar2 = 0;
  }
  else {
    n = 0;
    while( true ) {
      if (n == 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                      ,0xa59,
                      "ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *)"
                     );
      }
      bVar1 = column->field_0x65;
      uVar2 = TableGetColumnAvailSortDirection(column,n);
      if (uVar2 == (bVar1 & 3)) break;
      n = n + 1;
    }
    uVar2 = (uint)((byte)((char)n + 1U) % ((byte)column->field_0x65 >> 2 & 3));
  }
  IVar3 = TableGetColumnAvailSortDirection(column,uVar2);
  return IVar3;
}

Assistant:

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn* column)
{
    IM_ASSERT(column->SortDirectionsAvailCount > 0);
    if (column->SortOrder == -1)
        return TableGetColumnAvailSortDirection(column, 0);
    for (int n = 0; n < 3; n++)
        if (column->SortDirection == TableGetColumnAvailSortDirection(column, n))
            return TableGetColumnAvailSortDirection(column, (n + 1) % column->SortDirectionsAvailCount);
    IM_ASSERT(0);
    return ImGuiSortDirection_None;
}